

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O3

void indexed09_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  uint8_t *puVar1;
  anon_union_16_7_685e5830_for_cs_m680x_op_1 *word;
  cs_m680x_op *op;
  uint16_t uVar2;
  long lVar3;
  ushort uVar4;
  short sVar5;
  int16_t iVar6;
  long lVar7;
  byte bVar8;
  
  bVar8 = (info->m680x).op_count;
  (info->m680x).op_count = bVar8 + 1;
  op = (info->m680x).operands + bVar8;
  uVar4 = *address;
  *address = uVar4 + 1;
  lVar3 = (ulong)uVar4 - (ulong)info->offset;
  if ((uint)lVar3 < info->size) {
    bVar8 = info->code[lVar3];
  }
  else {
    bVar8 = 0;
  }
  op->type = M680X_OP_INDEXED;
  set_operand_size(info,op,(uint8_t)address);
  (op->field_1).imm = g_rr5_to_reg_ids[bVar8 >> 5 & 3];
  (op->field_1).idx.offset_reg = M680X_REG_INVALID;
  if (-1 < (char)bVar8) {
    uVar4 = (ushort)(char)(bVar8 | 0xf0);
    if ((bVar8 & 0x10) == 0) {
      uVar4 = (ushort)(bVar8 & 0xf);
    }
    (op->field_1).idx.offset = uVar4;
    (op->field_1).idx.offset_addr = uVar4 + *address;
    (op->field_1).idx.offset_bits = '\x05';
    goto switchD_00264b9e_caseD_4;
  }
  if ((bVar8 & 0x10) != 0) {
    puVar1 = &(op->field_1).idx.flags;
    *puVar1 = *puVar1 | 1;
  }
  word = &op->field_1;
  switch(bVar8 & 0x1f) {
  case 0:
    (op->field_1).idx.inc_dec = '\x01';
    goto LAB_00264d1f;
  case 1:
  case 0x11:
    (op->field_1).idx.inc_dec = '\x02';
LAB_00264d1f:
    puVar1 = &(op->field_1).idx.flags;
    *puVar1 = *puVar1 | 4;
    break;
  case 2:
    (op->field_1).idx.inc_dec = -1;
    break;
  case 3:
  case 0x13:
    (op->field_1).idx.inc_dec = -2;
    break;
  case 4:
  case 0x14:
    break;
  case 5:
  case 0x15:
    (op->field_1).idx.offset_reg = M680X_REG_B;
    break;
  case 6:
  case 0x16:
    (op->field_1).idx.offset_reg = M680X_REG_A;
    break;
  default:
    word->imm = 0;
    break;
  case 8:
  case 0x18:
    uVar4 = *address;
    *address = uVar4 + 1;
    lVar3 = (ulong)uVar4 - (ulong)info->offset;
    if ((uint)lVar3 < info->size) {
      bVar8 = info->code[lVar3];
      uVar4 = (ushort)bVar8;
      if ((char)bVar8 < '\0') {
        uVar4 = bVar8 | 0xff00;
      }
    }
    else {
      uVar4 = 0;
    }
    (op->field_1).idx.offset = uVar4;
    goto LAB_00264d05;
  case 9:
  case 0x19:
    lVar7 = (ulong)*address - (ulong)info->offset;
    lVar3 = lVar7 + 1;
    if ((uint)lVar3 < info->size) {
      iVar6 = CONCAT11(info->code[lVar7],info->code[lVar3]);
    }
    else {
      iVar6 = 0;
    }
    *address = *address + 2;
    (op->field_1).idx.offset = iVar6;
    goto LAB_00264ce6;
  case 0xb:
  case 0x1b:
    (op->field_1).idx.offset_reg = M680X_REG_D;
    break;
  case 0xc:
  case 0x1c:
    word->imm = 0x13;
    uVar4 = *address;
    uVar2 = uVar4 + 1;
    *address = uVar2;
    lVar3 = (ulong)uVar4 - (ulong)info->offset;
    if ((uint)lVar3 < info->size) {
      bVar8 = info->code[lVar3];
      uVar4 = (ushort)bVar8;
      if ((char)bVar8 < '\0') {
        uVar4 = bVar8 | 0xff00;
      }
    }
    else {
      uVar4 = 0;
    }
    (op->field_1).idx.offset_addr = uVar2;
    (op->field_1).idx.offset = uVar4;
LAB_00264d05:
    (op->field_1).idx.offset_bits = '\b';
    break;
  case 0xd:
  case 0x1d:
    word->imm = 0x13;
    uVar4 = *address;
    lVar7 = (ulong)uVar4 - (ulong)info->offset;
    lVar3 = lVar7 + 1;
    if ((uint)lVar3 < info->size) {
      sVar5 = CONCAT11(info->code[lVar7],info->code[lVar3]);
    }
    else {
      sVar5 = 0;
    }
    *address = uVar4 + 2;
    (op->field_1).idx.offset_addr = uVar4 + sVar5 + 2;
    (op->field_1).idx.offset = sVar5;
LAB_00264ce6:
    (op->field_1).idx.offset_bits = '\x10';
    break;
  case 0x1f:
    op->type = M680X_OP_EXTENDED;
    *(byte *)((long)&(op->field_1).reg + 2) = 1;
    read_word(info,(uint16_t *)&word->reg,*address);
    *address = *address + 2;
  }
switchD_00264b9e_caseD_4:
  if ((info->insn - M680X_INS_LEAS < 4) && ((info->m680x).operands[0].field_1.imm - 0xdU < 2)) {
    add_reg_to_rw_list((MCInst *)MI->flat_insn->detail,M680X_REG_CC,MODIFY);
    return;
  }
  return;
}

Assistant:

static void indexed09_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	cs_m680x *m680x = &info->m680x;
	cs_m680x_op *op = &m680x->operands[m680x->op_count++];
	uint8_t post_byte = 0;
	uint16_t offset = 0;
	int16_t soffset = 0;

	read_byte(info, &post_byte, (*address)++);

	op->type = M680X_OP_INDEXED;
	set_operand_size(info, op, 1);
	op->idx.base_reg = g_rr5_to_reg_ids[(post_byte >> 5) & 0x03];
	op->idx.offset_reg = M680X_REG_INVALID;

	if (!(post_byte & 0x80)) {
		// n5,R
		if ((post_byte & 0x10) == 0x10)
			op->idx.offset = post_byte | 0xfff0;
		else
			op->idx.offset = post_byte & 0x0f;

		op->idx.offset_addr = op->idx.offset + *address;
		op->idx.offset_bits = M680X_OFFSET_BITS_5;
	}
	else {
		if ((post_byte & 0x10) == 0x10)
			op->idx.flags |= M680X_IDX_INDIRECT;

		// indexed addressing
		switch (post_byte & 0x1f) {
		case 0x00: // ,R+
			op->idx.inc_dec = 1;
			op->idx.flags |= M680X_IDX_POST_INC_DEC;
			break;

		case 0x11: // [,R++]
		case 0x01: // ,R++
			op->idx.inc_dec = 2;
			op->idx.flags |= M680X_IDX_POST_INC_DEC;
			break;

		case 0x02: // ,-R
			op->idx.inc_dec = -1;
			break;

		case 0x13: // [,--R]
		case 0x03: // ,--R
			op->idx.inc_dec = -2;
			break;

		case 0x14: // [,R]
		case 0x04: // ,R
			break;

		case 0x15: // [B,R]
		case 0x05: // B,R
			op->idx.offset_reg = M680X_REG_B;
			break;

		case 0x16: // [A,R]
		case 0x06: // A,R
			op->idx.offset_reg = M680X_REG_A;
			break;

		case 0x1c: // [n8,PCR]
		case 0x0c: // n8,PCR
			op->idx.base_reg = M680X_REG_PC;
			read_byte_sign_extended(info, &soffset, (*address)++);
			op->idx.offset_addr = offset + *address;
			op->idx.offset = soffset;
			op->idx.offset_bits = M680X_OFFSET_BITS_8;
			break;

		case 0x18: // [n8,R]
		case 0x08: // n8,R
			read_byte_sign_extended(info, &soffset, (*address)++);
			op->idx.offset = soffset;
			op->idx.offset_bits = M680X_OFFSET_BITS_8;
			break;

		case 0x1d: // [n16,PCR]
		case 0x0d: // n16,PCR
			op->idx.base_reg = M680X_REG_PC;
			read_word(info, &offset, *address);
			*address += 2;
			op->idx.offset_addr = offset + *address;
			op->idx.offset = (int16_t)offset;
			op->idx.offset_bits = M680X_OFFSET_BITS_16;
			break;

		case 0x19: // [n16,R]
		case 0x09: // n16,R
			read_word(info, &offset, *address);
			*address += 2;
			op->idx.offset = (int16_t)offset;
			op->idx.offset_bits = M680X_OFFSET_BITS_16;
			break;

		case 0x1b: // [D,R]
		case 0x0b: // D,R
			op->idx.offset_reg = M680X_REG_D;
			break;

		case 0x1f: // [n16]
			op->type = M680X_OP_EXTENDED;
			op->ext.indirect = true;
			read_word(info, &op->ext.address, *address);
			*address += 2;
			break;

		default:
			op->idx.base_reg = M680X_REG_INVALID;
			break;
		}
	}

	if (((info->insn == M680X_INS_LEAU) ||
			(info->insn == M680X_INS_LEAS) ||
			(info->insn == M680X_INS_LEAX) ||
			(info->insn == M680X_INS_LEAY)) &&
		(m680x->operands[0].reg == M680X_REG_X ||
			(m680x->operands[0].reg == M680X_REG_Y)))
		// Only LEAX and LEAY modify CC register
		add_reg_to_rw_list(MI, M680X_REG_CC, MODIFY);
}